

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  ImGuiDockContext *dc;
  ImVector<ImGuiDockNodeSettings> *this;
  ImGuiDockNode *node;
  short sVar1;
  uint uVar2;
  ImGuiStoragePair *pIVar3;
  ImGuiDockNodeSettings *pIVar4;
  int n;
  int iVar5;
  int iVar6;
  ImGuiContext *g;
  char *pcVar7;
  int node_n_1;
  char *pcVar8;
  
  if (((ctx->IO).ConfigFlags & 0x40) == 0) {
    return;
  }
  dc = &ctx->DockContext;
  this = &(ctx->DockContext).NodesSettings;
  ImVector<ImGuiDockNodeSettings>::resize(this,0);
  ImVector<ImGuiDockNodeSettings>::reserve(this,(ctx->DockContext).Nodes.Data.Size);
  for (iVar5 = 0; iVar5 < (dc->Nodes).Data.Size; iVar5 = iVar5 + 1) {
    pIVar3 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                       ((ImVector<ImGuiStorage::ImGuiStoragePair> *)dc,iVar5);
    node = (ImGuiDockNode *)(pIVar3->field_1).val_p;
    if ((node != (ImGuiDockNode *)0x0) && (node->ParentNode == (ImGuiDockNode *)0x0)) {
      DockSettingsHandler_DockNodeToSettings(dc,node,0);
    }
  }
  iVar5 = 0;
  for (iVar6 = 0; iVar6 < this->Size; iVar6 = iVar6 + 1) {
    pIVar4 = ImVector<ImGuiDockNodeSettings>::operator[](this,iVar6);
    if (iVar5 < pIVar4->Depth) {
      iVar5 = (int)pIVar4->Depth;
    }
  }
  ImGuiTextBuffer::appendf(buf,"[%s][Data]\n",handler->TypeName);
  for (iVar6 = 0; iVar6 < this->Size; iVar6 = iVar6 + 1) {
    pIVar4 = ImVector<ImGuiDockNodeSettings>::operator[](this,iVar6);
    pcVar7 = "DockSpace";
    if (((uint)pIVar4->Flags >> 10 & 1) == 0) {
      pcVar7 = "DockNode ";
    }
    pcVar8 = "";
    ImGuiTextBuffer::appendf
              (buf,"%*s%s%*s",(ulong)(uint)(pIVar4->Depth * 2),"",pcVar7,
               (ulong)(uint)((iVar5 - pIVar4->Depth) * 2),"");
    ImGuiTextBuffer::appendf(buf," ID=0x%08X",(ulong)pIVar4->ID);
    if (pIVar4->ParentNodeId == 0) {
      if (pIVar4->ParentWindowId != 0) {
        ImGuiTextBuffer::appendf(buf," Window=0x%08X");
      }
      ImGuiTextBuffer::appendf
                (buf," Pos=%d,%d Size=%d,%d",(ulong)(uint)(int)(pIVar4->Pos).x,
                 (ulong)(uint)(int)(pIVar4->Pos).y,(ulong)(uint)(int)(pIVar4->Size).x,
                 (ulong)(uint)(int)(pIVar4->Size).y,pcVar8);
    }
    else {
      ImGuiTextBuffer::appendf
                (buf," Parent=0x%08X SizeRef=%d,%d",(ulong)pIVar4->ParentNodeId,
                 (ulong)(uint)(int)(pIVar4->SizeRef).x,(ulong)(uint)(int)(pIVar4->SizeRef).y);
    }
    if (pIVar4->SplitAxis != -1) {
      ImGuiTextBuffer::appendf(buf," Split=%c",(ulong)(0x59 - (pIVar4->SplitAxis == '\0')));
    }
    uVar2 = pIVar4->Flags;
    if ((uVar2 & 0x20) != 0) {
      ImGuiTextBuffer::appendf(buf," NoResize=1");
      uVar2 = pIVar4->Flags;
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      ImGuiTextBuffer::appendf(buf," CentralNode=1");
      uVar2 = pIVar4->Flags;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      ImGuiTextBuffer::appendf(buf," NoTabBar=1");
      uVar2 = pIVar4->Flags;
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      ImGuiTextBuffer::appendf(buf," HiddenTabBar=1");
      uVar2 = pIVar4->Flags;
    }
    sVar1 = (short)uVar2;
    if ((uVar2 >> 0xe & 1) != 0) {
      ImGuiTextBuffer::appendf(buf," NoWindowMenuButton=1");
      sVar1 = (short)pIVar4->Flags;
    }
    if (sVar1 < 0) {
      ImGuiTextBuffer::appendf(buf," NoCloseButton=1");
    }
    if (pIVar4->SelectedTabId != 0) {
      ImGuiTextBuffer::appendf(buf," Selected=0x%08X");
    }
    ImGuiTextBuffer::appendf(buf,"\n");
  }
  ImGuiTextBuffer::appendf(buf,"\n");
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Gather settings data
    // (unlike our windows settings, because nodes are always built we can do a full rewrite of the SettingsNode buffer)
    dc->NodesSettings.resize(0);
    dc->NodesSettings.reserve(dc->Nodes.Data.Size);
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsRootNode())
                DockSettingsHandler_DockNodeToSettings(dc, node, 0);

    int max_depth = 0;
    for (int node_n = 0; node_n < dc->NodesSettings.Size; node_n++)
        max_depth = ImMax((int)dc->NodesSettings[node_n].Depth, max_depth);

    // Write to text buffer
    buf->appendf("[%s][Data]\n", handler->TypeName);
    for (int node_n = 0; node_n < dc->NodesSettings.Size; node_n++)
    {
        const int line_start_pos = buf->size(); (void)line_start_pos;
        const ImGuiDockNodeSettings* node_settings = &dc->NodesSettings[node_n];
        buf->appendf("%*s%s%*s", node_settings->Depth * 2, "", (node_settings->Flags & ImGuiDockNodeFlags_DockSpace) ? "DockSpace" : "DockNode ", (max_depth - node_settings->Depth) * 2, "");  // Text align nodes to facilitate looking at .ini file
        buf->appendf(" ID=0x%08X", node_settings->ID);
        if (node_settings->ParentNodeId)
        {
            buf->appendf(" Parent=0x%08X SizeRef=%d,%d", node_settings->ParentNodeId, node_settings->SizeRef.x, node_settings->SizeRef.y);
        }
        else
        {
            if (node_settings->ParentWindowId)
                buf->appendf(" Window=0x%08X", node_settings->ParentWindowId);
            buf->appendf(" Pos=%d,%d Size=%d,%d", node_settings->Pos.x, node_settings->Pos.y, node_settings->Size.x, node_settings->Size.y);
        }
        if (node_settings->SplitAxis != ImGuiAxis_None)
            buf->appendf(" Split=%c", (node_settings->SplitAxis == ImGuiAxis_X) ? 'X' : 'Y');
        if (node_settings->Flags & ImGuiDockNodeFlags_NoResize)
            buf->appendf(" NoResize=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_CentralNode)
            buf->appendf(" CentralNode=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_NoTabBar)
            buf->appendf(" NoTabBar=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_HiddenTabBar)
            buf->appendf(" HiddenTabBar=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_NoWindowMenuButton)
            buf->appendf(" NoWindowMenuButton=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_NoCloseButton)
            buf->appendf(" NoCloseButton=1");
        if (node_settings->SelectedTabId)
            buf->appendf(" Selected=0x%08X", node_settings->SelectedTabId);

#if IMGUI_DEBUG_INI_SETTINGS
        // [DEBUG] Include comments in the .ini file to ease debugging
        if (ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_settings->ID))
        {
            buf->appendf("%*s", ImMax(2, (line_start_pos + 92) - buf->size()), "");     // Align everything
            if (node->IsDockSpace() && node->HostWindow && node->HostWindow->ParentWindow)
                buf->appendf(" ; in '%s'", node->HostWindow->ParentWindow->Name);
            // Iterate settings so we can give info about windows that didn't exist during the session.
            int contains_window = 0;
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                if (settings->DockId == node_settings->ID)
                {
                    if (contains_window++ == 0)
                        buf->appendf(" ; contains ");
                    buf->appendf("'%s' ", settings->GetName());
                }
        }
#endif
        buf->appendf("\n");
    }
    buf->appendf("\n");
}